

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O1

bool __thiscall Minisat::StringOption::parse(StringOption *this,char *str)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  char *span;
  char *pcVar5;
  bool bVar6;
  
  if (*str == '-') {
    pcVar5 = str + (*str == '-');
    pcVar3 = (this->super_Option).name;
    cVar2 = *pcVar3;
    bVar6 = cVar2 == '\0';
    if (bVar6) {
      lVar4 = 0;
LAB_0010472e:
      pcVar5 = pcVar5 + lVar4;
    }
    else if (*pcVar5 == cVar2) {
      lVar4 = 1;
      do {
        cVar2 = pcVar3[lVar4];
        bVar6 = cVar2 == '\0';
        if (bVar6) goto LAB_0010472e;
        pcVar1 = pcVar5 + lVar4;
        lVar4 = lVar4 + 1;
      } while (*pcVar1 == cVar2);
    }
    else {
      bVar6 = false;
    }
    if ((bVar6) && (*pcVar5 == '=')) {
      this->value = pcVar5 + 1;
      return true;
    }
  }
  return false;
}

Assistant:

static bool match(B& in, const char* str) {
    int i;
    for (i = 0; str[i] != '\0'; i++)
        if (in[i] != str[i])
            return false;

    in += i;

    return true; 
}